

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

BIT_DStream_status BIT_reloadDStream(BIT_DStream_t *bitD)

{
  uint uVar1;
  size_t sVar2;
  size_t *in_RDI;
  bool bVar3;
  BIT_DStream_status result;
  U32 nbBytes;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  BIT_DStream_status local_4;
  
  if ((uint)in_RDI[1] < 0x41) {
    if (in_RDI[2] < in_RDI[4]) {
      if (in_RDI[2] == in_RDI[3]) {
        if ((uint)in_RDI[1] < 0x40) {
          local_4 = BIT_DStream_endOfBuffer;
        }
        else {
          local_4 = BIT_DStream_completed;
        }
      }
      else {
        uVar1 = (uint)in_RDI[1] >> 3;
        bVar3 = in_RDI[2] - (ulong)uVar1 < in_RDI[3];
        if (bVar3) {
          uVar1 = (int)in_RDI[2] - (int)in_RDI[3];
        }
        local_4 = (BIT_DStream_status)bVar3;
        in_RDI[2] = in_RDI[2] - (ulong)uVar1;
        *(uint *)(in_RDI + 1) = (int)in_RDI[1] + uVar1 * -8;
        sVar2 = MEM_readLEST((void *)CONCAT44(uVar1,local_4));
        *in_RDI = sVar2;
      }
    }
    else {
      in_RDI[2] = in_RDI[2] - (ulong)((uint)in_RDI[1] >> 3);
      *(uint *)(in_RDI + 1) = (uint)in_RDI[1] & 7;
      sVar2 = MEM_readLEST((void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      *in_RDI = sVar2;
      local_4 = BIT_DStream_unfinished;
    }
  }
  else {
    local_4 = BIT_DStream_overflow;
  }
  return local_4;
}

Assistant:

MEM_STATIC BIT_DStream_status BIT_reloadDStream(BIT_DStream_t* bitD)
{
    if (bitD->bitsConsumed > (sizeof(bitD->bitContainer)*8))  /* overflow detected, like end of stream */
        return BIT_DStream_overflow;

    if (bitD->ptr >= bitD->limitPtr) {
        bitD->ptr -= bitD->bitsConsumed >> 3;
        bitD->bitsConsumed &= 7;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        return BIT_DStream_unfinished;
    }
    if (bitD->ptr == bitD->start) {
        if (bitD->bitsConsumed < sizeof(bitD->bitContainer)*8) return BIT_DStream_endOfBuffer;
        return BIT_DStream_completed;
    }
    /* start < ptr < limitPtr */
    {   U32 nbBytes = bitD->bitsConsumed >> 3;
        BIT_DStream_status result = BIT_DStream_unfinished;
        if (bitD->ptr - nbBytes < bitD->start) {
            nbBytes = (U32)(bitD->ptr - bitD->start);  /* ptr > start */
            result = BIT_DStream_endOfBuffer;
        }
        bitD->ptr -= nbBytes;
        bitD->bitsConsumed -= nbBytes*8;
        bitD->bitContainer = MEM_readLEST(bitD->ptr);   /* reminder : srcSize > sizeof(bitD->bitContainer), otherwise bitD->ptr == bitD->start */
        return result;
    }
}